

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct64_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 *puVar8;
  undefined1 (*pauVar9) [32];
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  undefined1 local_cc0 [32];
  undefined1 local_c60 [32];
  longlong local_ba0;
  longlong lStack_b98;
  longlong lStack_b90;
  longlong lStack_b88;
  int local_a60;
  int iStack_a5c;
  int iStack_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int iStack_a48;
  int iStack_a44;
  int local_a40;
  int iStack_a3c;
  int iStack_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  int iStack_a28;
  int iStack_a24;
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  longlong local_9e0;
  longlong lStack_9d8;
  longlong lStack_9d0;
  longlong lStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  __m256i local_840;
  __m256i local_820;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar11 = (long)bit * 0x100;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  iVar19 = bd + (uint)(do_cols == 0) * 2;
  local_a60 = 0x8000;
  if (0xf < iVar19 + 6) {
    local_a60 = 1 << ((char)iVar19 + 5U & 0x1f);
  }
  local_a40 = -local_a60;
  local_a60 = local_a60 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x164);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  local_cc0._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x16c);
  local_cc0._0_4_ = local_cc0._4_4_;
  local_cc0._8_4_ = local_cc0._4_4_;
  local_cc0._12_4_ = local_cc0._4_4_;
  local_cc0._16_4_ = local_cc0._4_4_;
  local_cc0._20_4_ = local_cc0._4_4_;
  local_cc0._24_4_ = local_cc0._4_4_;
  local_cc0._28_4_ = local_cc0._4_4_;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x174);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar63._16_4_ = uVar1;
  auVar63._20_4_ = uVar1;
  auVar63._24_4_ = uVar1;
  auVar63._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x17c);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x184);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x18c);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  local_c60._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x194);
  local_c60._0_4_ = local_c60._4_4_;
  local_c60._8_4_ = local_c60._4_4_;
  local_c60._12_4_ = local_c60._4_4_;
  local_c60._16_4_ = local_c60._4_4_;
  local_c60._20_4_ = local_c60._4_4_;
  local_c60._24_4_ = local_c60._4_4_;
  local_c60._28_4_ = local_c60._4_4_;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x19c);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x23c);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x24c);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x25c);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x224);
  auVar68._4_4_ = iVar19;
  auVar68._0_4_ = iVar19;
  auVar68._8_4_ = iVar19;
  auVar68._12_4_ = iVar19;
  auVar68._16_4_ = iVar19;
  auVar68._20_4_ = iVar19;
  auVar68._24_4_ = iVar19;
  auVar68._28_4_ = iVar19;
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x234);
  auVar55._4_4_ = iVar19;
  auVar55._0_4_ = iVar19;
  auVar55._8_4_ = iVar19;
  auVar55._12_4_ = iVar19;
  auVar55._16_4_ = iVar19;
  auVar55._20_4_ = iVar19;
  auVar55._24_4_ = iVar19;
  auVar55._28_4_ = iVar19;
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x244);
  auVar69._4_4_ = iVar19;
  auVar69._0_4_ = iVar19;
  auVar69._8_4_ = iVar19;
  auVar69._12_4_ = iVar19;
  auVar69._16_4_ = iVar19;
  auVar69._20_4_ = iVar19;
  auVar69._24_4_ = iVar19;
  auVar69._28_4_ = iVar19;
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x254);
  auVar67._4_4_ = iVar19;
  auVar67._0_4_ = iVar19;
  auVar67._8_4_ = iVar19;
  auVar67._12_4_ = iVar19;
  auVar67._16_4_ = iVar19;
  auVar67._20_4_ = iVar19;
  auVar67._24_4_ = iVar19;
  auVar67._28_4_ = iVar19;
  alVar4 = *in;
  pauVar9 = &local_360;
  local_840[0] = alVar4[0];
  local_840[1] = alVar4[1];
  local_840[2] = alVar4[2];
  local_840[3] = alVar4[3];
  auVar2 = vpmulld_avx2(auVar52,(undefined1  [32])in[1]);
  auVar3 = vpmulld_avx2(auVar39,(undefined1  [32])in[1]);
  auVar36 = vpmulld_avx2(auVar68,(undefined1  [32])in[0xf]);
  auVar35 = vpmulld_avx2(auVar35,(undefined1  [32])in[0xf]);
  auVar39 = vpmulld_avx2(auVar49,(undefined1  [32])in[9]);
  auVar37 = vpmulld_avx2(auVar46,(undefined1  [32])in[9]);
  auVar41 = vpmulld_avx2(auVar69,(undefined1  [32])in[7]);
  auVar30 = vpmulld_avx2(auVar30,(undefined1  [32])in[7]);
  auVar32 = vpmulld_avx2(auVar63,(undefined1  [32])in[5]);
  auVar42 = vpmulld_avx2(auVar59,(undefined1  [32])in[5]);
  auVar43 = vpmulld_avx2(auVar55,(undefined1  [32])in[0xb]);
  auVar44 = vpmulld_avx2(auVar62,(undefined1  [32])in[0xb]);
  auVar46 = vpmulld_avx2(auVar67,(undefined1  [32])in[3]);
  auVar47 = vpmulld_avx2((undefined1  [32])in[3],local_cc0);
  auVar49 = vpmulld_avx2((undefined1  [32])in[0xd],local_c60);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x22c);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  auVar31 = vpmulld_avx2(auVar31,(undefined1  [32])in[0xd]);
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  auVar20 = vpmulld_avx2(auVar20,(undefined1  [32])in[2]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  auVar21 = vpmulld_avx2(auVar21,(undefined1  [32])in[2]);
  auVar22._4_4_ = iVar19;
  auVar22._0_4_ = iVar19;
  auVar22._8_4_ = iVar19;
  auVar22._12_4_ = iVar19;
  auVar22._16_4_ = iVar19;
  auVar22._20_4_ = iVar19;
  auVar22._24_4_ = iVar19;
  auVar22._28_4_ = iVar19;
  auVar22 = vpmulld_avx2(auVar22,(undefined1  [32])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  auVar23 = vpmulld_avx2(auVar23,(undefined1  [32])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  auVar24 = vpmulld_avx2(auVar24,(undefined1  [32])in[10]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar25 = vpmulld_avx2(auVar25,(undefined1  [32])in[10]);
  iVar19 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  auVar26._4_4_ = iVar19;
  auVar26._0_4_ = iVar19;
  auVar26._8_4_ = iVar19;
  auVar26._12_4_ = iVar19;
  auVar26._16_4_ = iVar19;
  auVar26._20_4_ = iVar19;
  auVar26._24_4_ = iVar19;
  auVar26._28_4_ = iVar19;
  auVar26 = vpmulld_avx2(auVar26,(undefined1  [32])in[6]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[6]);
  auVar28._4_4_ = iVar13;
  auVar28._0_4_ = iVar13;
  auVar28._8_4_ = iVar13;
  auVar28._12_4_ = iVar13;
  auVar28._16_4_ = iVar13;
  auVar28._20_4_ = iVar13;
  auVar28._24_4_ = iVar13;
  auVar28._28_4_ = iVar13;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  local_8e0._4_4_ = iVar19;
  local_8e0._0_4_ = iVar19;
  local_8e0._8_4_ = iVar19;
  local_8e0._12_4_ = iVar19;
  local_8e0._16_4_ = iVar19;
  local_8e0._20_4_ = iVar19;
  local_8e0._24_4_ = iVar19;
  local_8e0._28_4_ = iVar19;
  iVar18 = -iVar13;
  local_8a0._4_4_ = iVar18;
  local_8a0._0_4_ = iVar18;
  local_8a0._8_4_ = iVar18;
  local_8a0._12_4_ = iVar18;
  local_8a0._16_4_ = iVar18;
  local_8a0._20_4_ = iVar18;
  local_8a0._24_4_ = iVar18;
  local_8a0._28_4_ = iVar18;
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_920 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpaddd_avx2(auVar3,auVar28);
  local_940 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  auVar2 = vpmulld_avx2(local_920,local_8e0);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar3 = vpmulld_avx2(local_940,local_8a0);
  local_860 = vpaddd_avx2(auVar2,auVar3);
  iVar19 = -iVar19;
  auVar53._4_4_ = iVar19;
  auVar53._0_4_ = iVar19;
  auVar53._8_4_ = iVar19;
  auVar53._12_4_ = iVar19;
  auVar53._16_4_ = iVar19;
  auVar53._20_4_ = iVar19;
  auVar53._24_4_ = iVar19;
  auVar53._28_4_ = iVar19;
  auVar2 = vpaddd_avx2(auVar36,auVar28);
  auVar61 = ZEXT416((uint)bit);
  local_3e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar35,auVar28);
  local_9a0 = vpsrad_avx2(auVar2,auVar61);
  auVar3 = vpmulld_avx2(local_3e0,auVar53);
  auVar2 = vpmulld_avx2(local_9a0,local_8a0);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  local_880 = vpaddd_avx2(auVar3,auVar2);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  auVar64._4_4_ = iVar19;
  auVar64._0_4_ = iVar19;
  auVar64._8_4_ = iVar19;
  auVar64._12_4_ = iVar19;
  auVar64._16_4_ = iVar19;
  auVar64._20_4_ = iVar19;
  auVar64._24_4_ = iVar19;
  auVar64._28_4_ = iVar19;
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  local_a10 = ZEXT416(uVar10);
  iVar18 = -uVar10;
  auVar2 = vpaddd_avx2(auVar28,auVar39);
  local_e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar37,auVar28);
  local_3c0 = vpsrad_avx2(auVar2,auVar61);
  auVar36._4_4_ = iVar18;
  auVar36._0_4_ = iVar18;
  auVar36._8_4_ = iVar18;
  auVar36._12_4_ = iVar18;
  auVar36._16_4_ = iVar18;
  auVar36._20_4_ = iVar18;
  auVar36._24_4_ = iVar18;
  auVar36._28_4_ = iVar18;
  auVar2 = vpmulld_avx2(local_e0,auVar64);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar3 = vpmulld_avx2(local_3c0,auVar36);
  local_8c0 = vpaddd_avx2(auVar2,auVar3);
  iVar19 = -iVar19;
  auVar40._4_4_ = iVar19;
  auVar40._0_4_ = iVar19;
  auVar40._8_4_ = iVar19;
  auVar40._12_4_ = iVar19;
  auVar40._16_4_ = iVar19;
  auVar40._20_4_ = iVar19;
  auVar40._24_4_ = iVar19;
  auVar40._28_4_ = iVar19;
  auVar2 = vpaddd_avx2(auVar28,auVar41);
  auVar61 = ZEXT416((uint)bit);
  local_360 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar30);
  local_140 = vpsrad_avx2(auVar2,auVar61);
  auVar3 = vpmulld_avx2(local_360,auVar40);
  auVar2 = vpmulld_avx2(local_140,auVar36);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  local_900 = vpaddd_avx2(auVar3,auVar2);
  local_9e0 = in[0xc][0];
  lStack_9d8 = in[0xc][1];
  lStack_9d0 = in[0xc][2];
  lStack_9c8 = in[0xc][3];
  alVar7 = in[0xc];
  local_60 = local_920;
  local_440 = local_940;
  local_c0 = local_9a0;
  auVar3 = vpmulld_avx2(local_360,auVar36);
  auVar2 = vpmulld_avx2(local_140,auVar64);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  local_a00 = vpaddd_avx2(auVar3,auVar2);
  auVar56._4_4_ = iVar13;
  auVar56._0_4_ = iVar13;
  auVar56._8_4_ = iVar13;
  auVar56._12_4_ = iVar13;
  auVar56._16_4_ = iVar13;
  auVar56._20_4_ = iVar13;
  auVar56._24_4_ = iVar13;
  auVar56._28_4_ = iVar13;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 400);
  auVar41._4_4_ = iVar13;
  auVar41._0_4_ = iVar13;
  auVar41._8_4_ = iVar13;
  auVar41._12_4_ = iVar13;
  auVar41._16_4_ = iVar13;
  auVar41._20_4_ = iVar13;
  auVar41._24_4_ = iVar13;
  auVar41._28_4_ = iVar13;
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  iVar18 = -iVar19;
  auVar2 = vpaddd_avx2(auVar28,auVar32);
  local_160 = vpsrad_avx2(auVar2,auVar61);
  auVar37._4_4_ = iVar18;
  auVar37._0_4_ = iVar18;
  auVar37._8_4_ = iVar18;
  auVar37._12_4_ = iVar18;
  auVar37._16_4_ = iVar18;
  auVar37._20_4_ = iVar18;
  auVar37._24_4_ = iVar18;
  auVar37._28_4_ = iVar18;
  auVar2 = vpaddd_avx2(auVar28,auVar42);
  local_340 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar43);
  local_2e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar44);
  local_960 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar46);
  local_260 = vpsrad_avx2(auVar2,auVar61);
  local_1c0 = local_960;
  auVar2 = vpaddd_avx2(auVar28,auVar47);
  local_240 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar49);
  auVar61 = ZEXT416((uint)bit);
  local_980 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar31);
  local_9c0 = vpsrad_avx2(auVar2,auVar61);
  local_1e0 = local_980;
  auVar2 = vpaddd_avx2(auVar28,auVar20);
  local_460 = vpsrad_avx2(auVar2,auVar61);
  local_2c0 = local_9c0;
  auVar2 = vpaddd_avx2(auVar28,auVar21);
  local_640 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar22);
  local_5e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar23);
  local_4c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar24);
  local_4e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar25);
  local_5c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar26);
  local_560 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(auVar28,auVar27);
  local_540 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar56,(undefined1  [32])in[4]);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_660 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_8e0,(undefined1  [32])in[4]);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_740 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar37,(undefined1  [32])alVar7);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_6e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar41,(undefined1  [32])alVar7);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_6c0 = vpsrad_avx2(auVar2,auVar61);
  local_120 = vpsrad_avx2(local_a00,auVar61);
  auVar3 = vpmulld_avx2(local_3c0,auVar64);
  auVar50._4_4_ = uVar10;
  auVar50._0_4_ = uVar10;
  auVar50._8_4_ = uVar10;
  auVar50._12_4_ = uVar10;
  auVar50._16_4_ = uVar10;
  auVar50._20_4_ = uVar10;
  auVar50._24_4_ = uVar10;
  auVar50._28_4_ = uVar10;
  auVar2 = vpmulld_avx2(local_e0,auVar50);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_100 = vpsrad_avx2(auVar2,auVar61);
  auVar3 = vpmulld_avx2(local_3e0,local_8a0);
  auVar2 = vpmulld_avx2(local_8e0,local_9a0);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar61 = ZEXT416((uint)bit);
  local_a0 = vpsrad_avx2(auVar2,auVar61);
  auVar3 = vpmulld_avx2(local_8e0,local_940);
  auVar2 = vpmulld_avx2(auVar56,local_920);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_420 = vpsrad_avx2(local_860,auVar61);
  local_80 = vpsrad_avx2(auVar2,auVar61);
  local_400 = vpsrad_avx2(local_880,auVar61);
  local_3a0 = vpsrad_avx2(local_8c0,auVar61);
  local_380 = vpsrad_avx2(local_900,auVar61);
  iVar18 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar58._4_4_ = iVar14;
  auVar58._0_4_ = iVar14;
  auVar58._8_4_ = iVar14;
  auVar58._12_4_ = iVar14;
  auVar58._16_4_ = iVar14;
  auVar58._20_4_ = iVar14;
  auVar58._24_4_ = iVar14;
  auVar58._28_4_ = iVar14;
  iVar16 = -iVar18;
  auVar65._4_4_ = iVar16;
  auVar65._0_4_ = iVar16;
  auVar65._8_4_ = iVar16;
  auVar65._12_4_ = iVar16;
  auVar65._16_4_ = iVar16;
  auVar65._20_4_ = iVar16;
  auVar65._24_4_ = iVar16;
  auVar65._28_4_ = iVar16;
  auVar2 = vpmulld_avx2(auVar58,local_160);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar3 = vpmulld_avx2(auVar65,local_340);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  iVar14 = -iVar14;
  auVar60._4_4_ = iVar14;
  auVar60._0_4_ = iVar14;
  auVar60._8_4_ = iVar14;
  auVar60._12_4_ = iVar14;
  auVar60._16_4_ = iVar14;
  auVar60._20_4_ = iVar14;
  auVar60._24_4_ = iVar14;
  auVar60._28_4_ = iVar14;
  auVar36 = vpmulld_avx2(local_2e0,auVar60);
  auVar3 = vpmulld_avx2(local_960,auVar65);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar36,auVar3);
  auVar36 = vpmulld_avx2(local_980,auVar41);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar35 = vpmulld_avx2(local_9c0,auVar37);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  iVar13 = -iVar13;
  auVar70._4_4_ = iVar13;
  auVar70._0_4_ = iVar13;
  auVar70._8_4_ = iVar13;
  auVar70._12_4_ = iVar13;
  auVar70._16_4_ = iVar13;
  auVar70._20_4_ = iVar13;
  auVar70._24_4_ = iVar13;
  auVar70._28_4_ = iVar13;
  auVar39 = vpmulld_avx2(local_260,auVar70);
  auVar35 = vpmulld_avx2(local_240,auVar37);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar35 = vpaddd_avx2(auVar39,auVar35);
  auVar37 = vpmulld_avx2(local_260,auVar37);
  auVar39 = vpmulld_avx2(local_240,auVar41);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar37,auVar39);
  local_220 = vpsrad_avx2(auVar39,auVar61);
  auVar37 = vpmulld_avx2(local_9c0,auVar41);
  auVar42._4_4_ = iVar19;
  auVar42._0_4_ = iVar19;
  auVar42._8_4_ = iVar19;
  auVar42._12_4_ = iVar19;
  auVar42._16_4_ = iVar19;
  auVar42._20_4_ = iVar19;
  auVar42._24_4_ = iVar19;
  auVar42._28_4_ = iVar19;
  auVar39 = vpmulld_avx2(local_980,auVar42);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_200 = vpsrad_avx2(auVar39,auVar61);
  auVar37 = vpmulld_avx2(local_2e0,auVar65);
  auVar39 = vpmulld_avx2(local_960,auVar58);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar37,auVar39);
  local_1a0 = vpsrad_avx2(auVar39,auVar61);
  auVar37 = vpmulld_avx2(auVar58,local_340);
  auVar43._4_4_ = iVar18;
  auVar43._0_4_ = iVar18;
  auVar43._8_4_ = iVar18;
  auVar43._12_4_ = iVar18;
  auVar43._16_4_ = iVar18;
  auVar43._20_4_ = iVar18;
  auVar43._24_4_ = iVar18;
  auVar43._28_4_ = iVar18;
  auVar39 = vpmulld_avx2(auVar43,local_160);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_320 = vpsrad_avx2(auVar2,auVar61);
  local_180 = vpsrad_avx2(auVar39,auVar61);
  local_300 = vpsrad_avx2(auVar3,auVar61);
  local_2a0 = vpsrad_avx2(auVar36,auVar61);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  local_280 = vpsrad_avx2(auVar35,auVar61);
  auVar71._4_4_ = iVar13;
  auVar71._0_4_ = iVar13;
  auVar71._8_4_ = iVar13;
  auVar71._12_4_ = iVar13;
  auVar71._16_4_ = iVar13;
  auVar71._20_4_ = iVar13;
  auVar71._24_4_ = iVar13;
  auVar71._28_4_ = iVar13;
  auVar2 = vpmulld_avx2(auVar71,(undefined1  [32])in[8]);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_760 = vpsrad_avx2(auVar2,auVar61);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  auVar54._4_4_ = iVar19;
  auVar54._0_4_ = iVar19;
  auVar54._8_4_ = iVar19;
  auVar54._12_4_ = iVar19;
  auVar54._16_4_ = iVar19;
  auVar54._20_4_ = iVar19;
  auVar54._24_4_ = iVar19;
  auVar54._28_4_ = iVar19;
  auVar2 = vpmulld_avx2(auVar54,(undefined1  [32])in[8]);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_7c0 = vpsrad_avx2(auVar2,auVar61);
  iVar13 = -iVar13;
  local_720 = local_740;
  auVar66._4_4_ = iVar13;
  auVar66._0_4_ = iVar13;
  auVar66._8_4_ = iVar13;
  auVar66._12_4_ = iVar13;
  auVar66._16_4_ = iVar13;
  auVar66._20_4_ = iVar13;
  auVar66._24_4_ = iVar13;
  auVar66._28_4_ = iVar13;
  iVar19 = -iVar19;
  local_700 = local_6e0;
  auVar32._4_4_ = iVar19;
  auVar32._0_4_ = iVar19;
  auVar32._8_4_ = iVar19;
  auVar32._12_4_ = iVar19;
  auVar32._16_4_ = iVar19;
  auVar32._20_4_ = iVar19;
  auVar32._24_4_ = iVar19;
  auVar32._28_4_ = iVar19;
  local_6a0 = local_6c0;
  local_680 = local_660;
  auVar3 = vpmulld_avx2(auVar66,local_640);
  auVar2 = vpmulld_avx2(auVar54,local_460);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_4c0,auVar66);
  auVar3 = vpaddd_avx2(auVar28,auVar3);
  auVar36 = vpmulld_avx2(local_5e0,auVar32);
  auVar3 = vpaddd_avx2(auVar36,auVar3);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  auVar47._4_4_ = iVar13;
  auVar47._0_4_ = iVar13;
  auVar47._8_4_ = iVar13;
  auVar47._12_4_ = iVar13;
  auVar47._16_4_ = iVar13;
  auVar47._20_4_ = iVar13;
  auVar47._24_4_ = iVar13;
  auVar47._28_4_ = iVar13;
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  iVar18 = -iVar19;
  auVar57._4_4_ = iVar18;
  auVar57._0_4_ = iVar18;
  auVar57._8_4_ = iVar18;
  auVar57._12_4_ = iVar18;
  auVar57._16_4_ = iVar18;
  auVar57._20_4_ = iVar18;
  auVar57._24_4_ = iVar18;
  auVar57._28_4_ = iVar18;
  auVar36 = vpmulld_avx2(local_4e0,auVar47);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar35 = vpmulld_avx2(local_5c0,auVar57);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  iVar13 = -iVar13;
  auVar51._4_4_ = iVar13;
  auVar51._0_4_ = iVar13;
  auVar51._8_4_ = iVar13;
  auVar51._12_4_ = iVar13;
  auVar51._16_4_ = iVar13;
  auVar51._20_4_ = iVar13;
  auVar51._24_4_ = iVar13;
  auVar51._28_4_ = iVar13;
  auVar35 = vpmulld_avx2(local_540,auVar57);
  auVar35 = vpaddd_avx2(auVar28,auVar35);
  auVar39 = vpmulld_avx2(local_560,auVar51);
  auVar35 = vpaddd_avx2(auVar39,auVar35);
  auVar37 = vpmulld_avx2(local_560,auVar57);
  auVar39 = vpmulld_avx2(local_540,auVar47);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar37,auVar39);
  local_520 = vpsrad_avx2(auVar39,auVar61);
  auVar44._4_4_ = iVar19;
  auVar44._0_4_ = iVar19;
  auVar44._8_4_ = iVar19;
  auVar44._12_4_ = iVar19;
  auVar44._16_4_ = iVar19;
  auVar44._20_4_ = iVar19;
  auVar44._24_4_ = iVar19;
  auVar44._28_4_ = iVar19;
  auVar37 = vpmulld_avx2(local_5c0,auVar47);
  auVar39 = vpmulld_avx2(local_4e0,auVar44);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  auVar41 = vpmulld_avx2(local_5e0,auVar66);
  auVar37 = vpmulld_avx2(local_4c0,auVar54);
  auVar37 = vpaddd_avx2(auVar28,auVar37);
  auVar37 = vpaddd_avx2(auVar41,auVar37);
  local_500 = vpsrad_avx2(auVar39,auVar61);
  local_4a0 = vpsrad_avx2(auVar37,auVar61);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  iVar18 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  auVar37 = vpmulld_avx2(auVar54,local_640);
  auVar39 = vpmulld_avx2(auVar71,local_460);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_620 = vpsrad_avx2(auVar2,auVar61);
  iVar16 = -iVar13;
  local_480 = vpsrad_avx2(auVar39,auVar61);
  iVar17 = -iVar19;
  local_600 = vpsrad_avx2(auVar3,auVar61);
  local_5a0 = vpsrad_avx2(auVar36,auVar61);
  iVar14 = -iVar18;
  local_580 = vpsrad_avx2(auVar35,auVar61);
  uVar12 = 0x18;
  auVar3._4_4_ = local_a40;
  auVar3._0_4_ = local_a40;
  auVar3._8_4_ = local_a40;
  auVar3._12_4_ = local_a40;
  auVar3._16_4_ = local_a40;
  auVar3._20_4_ = local_a40;
  auVar3._24_4_ = local_a40;
  auVar3._28_4_ = local_a40;
  auVar2._4_4_ = local_a60;
  auVar2._0_4_ = local_a60;
  auVar2._8_4_ = local_a60;
  auVar2._12_4_ = local_a60;
  auVar2._16_4_ = local_a60;
  auVar2._20_4_ = local_a60;
  auVar2._24_4_ = local_a60;
  auVar2._28_4_ = local_a60;
  do {
    auVar36 = vpaddd_avx2(pauVar9[-4],pauVar9[-7]);
    auVar39 = vpsubd_avx2(pauVar9[-7],pauVar9[-4]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-7] = auVar35;
    pauVar9[-4] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-5],pauVar9[-6]);
    auVar39 = vpsubd_avx2(pauVar9[-6],pauVar9[-5]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-6] = auVar35;
    pauVar9[-5] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-3],*pauVar9);
    auVar39 = vpsubd_avx2(*pauVar9,pauVar9[-3]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    *pauVar9 = auVar35;
    pauVar9[-3] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-2],pauVar9[-1]);
    auVar39 = vpsubd_avx2(pauVar9[-1],pauVar9[-2]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-1] = auVar35;
    pauVar9[-2] = auVar36;
    uVar12 = uVar12 + 8;
    pauVar9 = pauVar9 + 8;
  } while (uVar12 < 0x38);
  auVar33._4_4_ = iVar13;
  auVar33._0_4_ = iVar13;
  auVar33._8_4_ = iVar13;
  auVar33._12_4_ = iVar13;
  auVar33._16_4_ = iVar13;
  auVar33._20_4_ = iVar13;
  auVar33._24_4_ = iVar13;
  auVar33._28_4_ = iVar13;
  auVar29._4_4_ = iVar19;
  auVar29._0_4_ = iVar19;
  auVar29._8_4_ = iVar19;
  auVar29._12_4_ = iVar19;
  auVar29._16_4_ = iVar19;
  auVar29._20_4_ = iVar19;
  auVar29._24_4_ = iVar19;
  auVar29._28_4_ = iVar19;
  auVar38._4_4_ = iVar18;
  auVar38._0_4_ = iVar18;
  auVar38._8_4_ = iVar18;
  auVar38._12_4_ = iVar18;
  auVar38._16_4_ = iVar18;
  auVar38._20_4_ = iVar18;
  auVar38._24_4_ = iVar18;
  auVar38._28_4_ = iVar18;
  auVar48._4_4_ = iVar16;
  auVar48._0_4_ = iVar16;
  auVar48._8_4_ = iVar16;
  auVar48._12_4_ = iVar16;
  auVar48._16_4_ = iVar16;
  auVar48._20_4_ = iVar16;
  auVar48._24_4_ = iVar16;
  auVar48._28_4_ = iVar16;
  pauVar9 = &local_560;
  auVar36 = vpmulld_avx2(auVar29,(undefined1  [32])alVar4);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  alVar4 = (__m256i)vpsrad_avx2(auVar36,auVar61);
  local_820[0] = alVar4[0];
  local_820[1] = alVar4[1];
  local_820[2] = alVar4[2];
  local_820[3] = alVar4[3];
  local_840[0] = alVar4[0];
  local_840[1] = alVar4[1];
  local_840[2] = alVar4[2];
  local_840[3] = alVar4[3];
  local_7a0 = local_7c0;
  local_780 = local_760;
  auVar36 = vpmulld_avx2(local_740,auVar48);
  auVar35 = vpmulld_avx2(local_660,auVar38);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar35,auVar36);
  local_720 = vpsrad_avx2(auVar36,auVar61);
  auVar36 = vpmulld_avx2(local_740,auVar38);
  auVar35 = vpmulld_avx2(local_660,auVar33);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  local_680 = vpsrad_avx2(auVar36,auVar61);
  auVar34._4_4_ = iVar14;
  auVar34._0_4_ = iVar14;
  auVar34._8_4_ = iVar14;
  auVar34._12_4_ = iVar14;
  auVar34._16_4_ = iVar14;
  auVar34._20_4_ = iVar14;
  auVar34._24_4_ = iVar14;
  auVar34._28_4_ = iVar14;
  auVar36 = vpmulld_avx2(local_6e0,auVar34);
  auVar35 = vpmulld_avx2(local_6c0,auVar48);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  local_700 = vpsrad_avx2(auVar36,auVar61);
  auVar36 = vpmulld_avx2(local_6e0,auVar48);
  auVar35 = vpmulld_avx2(local_6c0,auVar38);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  local_6a0 = vpsrad_avx2(auVar36,auVar61);
  uVar12 = 8;
  do {
    auVar36 = vpaddd_avx2(pauVar9[-4],pauVar9[-7]);
    auVar39 = vpsubd_avx2(pauVar9[-7],pauVar9[-4]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-7] = auVar35;
    pauVar9[-4] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-5],pauVar9[-6]);
    auVar39 = vpsubd_avx2(pauVar9[-6],pauVar9[-5]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-6] = auVar35;
    pauVar9[-5] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-3],*pauVar9);
    auVar39 = vpsubd_avx2(*pauVar9,pauVar9[-3]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    *pauVar9 = auVar35;
    pauVar9[-3] = auVar36;
    auVar36 = vpaddd_avx2(pauVar9[-2],pauVar9[-1]);
    auVar39 = vpsubd_avx2(pauVar9[-1],pauVar9[-2]);
    auVar36 = vpmaxsd_avx2(auVar36,auVar3);
    auVar35 = vpminsd_avx2(auVar36,auVar2);
    auVar36 = vpmaxsd_avx2(auVar39,auVar3);
    auVar36 = vpminsd_avx2(auVar36,auVar2);
    pauVar9[-1] = auVar35;
    pauVar9[-2] = auVar36;
    uVar12 = uVar12 + 8;
    pauVar9 = pauVar9 + 8;
  } while (uVar12 < 0x18);
  puVar8 = local_440;
  auVar2 = vpmulld_avx2(local_400,auVar66);
  auVar3 = vpmulld_avx2(local_a0,auVar54);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_3e0,auVar66);
  auVar3 = vpaddd_avx2(auVar28,auVar3);
  auVar36 = vpmulld_avx2(local_c0,auVar54);
  auVar3 = vpaddd_avx2(auVar36,auVar3);
  auVar36 = vpmulld_avx2(local_3c0,auVar32);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar35 = vpmulld_avx2(local_e0,auVar66);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_3a0,auVar32);
  auVar35 = vpaddd_avx2(auVar28,auVar35);
  auVar39 = vpmulld_avx2(local_100,auVar66);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpmulld_avx2(local_3a0,auVar66);
  auVar37 = vpmulld_avx2(local_100,auVar54);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_100 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(local_3c0,auVar66);
  auVar37 = vpmulld_avx2(local_e0,auVar54);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar37,auVar39);
  local_e0 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpsrad_avx2(auVar2,auVar61);
  auVar61 = ZEXT416((uint)bit);
  auVar37 = vpsrad_avx2(auVar3,auVar61);
  local_3c0 = vpsrad_avx2(auVar36,auVar61);
  local_3a0 = vpsrad_avx2(auVar35,auVar61);
  auVar2 = vpmulld_avx2(local_3e0,auVar54);
  auVar3 = vpmulld_avx2(local_c0,auVar71);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_400,auVar54);
  auVar3 = vpmulld_avx2(local_a0,auVar71);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_a0 = vpsrad_avx2(auVar2,auVar61);
  local_400 = auVar39;
  local_3e0 = auVar37;
  auVar2 = vpmulld_avx2(local_300,auVar57);
  auVar3 = vpmulld_avx2(local_1a0,auVar47);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_2e0,auVar57);
  auVar36 = vpmulld_avx2(local_1c0,auVar47);
  auVar3 = vpaddd_avx2(auVar28,auVar3);
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar36 = vpmulld_avx2(local_2c0,auVar51);
  auVar35 = vpmulld_avx2(local_1e0,auVar57);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_2a0,auVar51);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar39 = vpmulld_avx2(local_200,auVar57);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpmulld_avx2(local_2a0,auVar57);
  auVar37 = vpmulld_avx2(local_200,auVar47);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  auVar37 = vpsrad_avx2(auVar2,auVar61);
  auVar41 = vpsrad_avx2(auVar3,auVar61);
  auVar36 = vpsrad_avx2(auVar36,auVar61);
  local_2a0 = vpsrad_avx2(auVar35,auVar61);
  local_200 = vpsrad_avx2(auVar39,auVar61);
  auVar45._4_4_ = iVar17;
  auVar45._0_4_ = iVar17;
  auVar45._8_4_ = iVar17;
  auVar45._12_4_ = iVar17;
  auVar45._16_4_ = iVar17;
  auVar45._20_4_ = iVar17;
  auVar45._24_4_ = iVar17;
  auVar45._28_4_ = iVar17;
  auVar2 = vpmulld_avx2(local_2c0,auVar57);
  auVar3 = vpmulld_avx2(local_1e0,auVar47);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_1e0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_2e0,auVar47);
  auVar3 = vpmulld_avx2(local_1c0,auVar44);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_1c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar47,local_300);
  auVar3 = vpmulld_avx2(local_1a0,auVar44);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_1a0 = vpsrad_avx2(auVar2,auVar61);
  local_300 = auVar37;
  local_2e0 = auVar41;
  local_2c0 = auVar36;
  local_ba0 = alVar4[0];
  lStack_b98 = alVar4[1];
  lStack_b90 = alVar4[2];
  lStack_b88 = alVar4[3];
  local_7e0 = local_ba0;
  lStack_7d8 = lStack_b98;
  lStack_7d0 = lStack_b90;
  lStack_7c8 = lStack_b88;
  local_800 = local_ba0;
  lStack_7f8 = lStack_b98;
  lStack_7f0 = lStack_b90;
  lStack_7e8 = lStack_b88;
  auVar2 = vpmulld_avx2(local_7c0,auVar45);
  auVar3 = vpmulld_avx2(local_760,auVar29);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_7a0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_760,local_7c0);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  local_780 = vpsrad_avx2(auVar2,auVar61);
  auVar6._4_4_ = local_a40;
  auVar6._0_4_ = local_a40;
  auVar6._8_4_ = local_a40;
  auVar6._12_4_ = local_a40;
  auVar6._16_4_ = local_a40;
  auVar6._20_4_ = local_a40;
  auVar6._24_4_ = local_a40;
  auVar6._28_4_ = local_a40;
  auVar5._4_4_ = local_a60;
  auVar5._0_4_ = local_a60;
  auVar5._8_4_ = local_a60;
  auVar5._12_4_ = local_a60;
  auVar5._16_4_ = local_a60;
  auVar5._20_4_ = local_a60;
  auVar5._24_4_ = local_a60;
  auVar5._28_4_ = local_a60;
  auVar2 = vpaddd_avx2(local_6e0,local_740);
  auVar3 = vpsubd_avx2(local_740,local_6e0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_740 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6e0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_700,local_720);
  auVar3 = vpsubd_avx2(local_720,local_700);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_720 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_700 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6c0,local_660);
  auVar3 = vpsubd_avx2(local_660,local_6c0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_660 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6c0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpaddd_avx2(local_6a0,local_680);
  auVar3 = vpsubd_avx2(local_680,local_6a0);
  auVar2 = vpmaxsd_avx2(auVar2,auVar6);
  local_680 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmaxsd_avx2(auVar3,auVar6);
  local_6a0 = vpminsd_avx2(auVar2,auVar5);
  auVar2 = vpmulld_avx2(local_600,auVar48);
  auVar3 = vpmulld_avx2(local_4a0,auVar38);
  auVar2 = vpaddd_avx2(auVar28,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_5e0,auVar48);
  auVar36 = vpmulld_avx2(local_4c0,auVar38);
  auVar3 = vpaddd_avx2(auVar28,auVar3);
  auVar3 = vpaddd_avx2(auVar36,auVar3);
  auVar36 = vpmulld_avx2(local_5c0,auVar34);
  auVar35 = vpmulld_avx2(local_4e0,auVar48);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_5a0,auVar48);
  auVar39 = vpmulld_avx2(local_500,auVar38);
  auVar35 = vpaddd_avx2(auVar28,auVar35);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpmulld_avx2(local_5a0,auVar34);
  auVar37 = vpmulld_avx2(local_500,auVar48);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  local_500 = vpsrad_avx2(auVar35,auVar61);
  auVar35 = vpaddd_avx2(auVar39,auVar37);
  auVar39 = vpmulld_avx2(local_5c0,auVar48);
  auVar37 = vpmulld_avx2(local_4e0,auVar38);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_4e0 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(auVar38,local_5e0);
  auVar37 = vpmulld_avx2(local_4c0,auVar33);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_4c0 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(auVar38,local_600);
  auVar37 = vpmulld_avx2(auVar33,local_4a0);
  auVar39 = vpaddd_avx2(auVar28,auVar39);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_600 = vpsrad_avx2(auVar2,auVar61);
  local_4a0 = vpsrad_avx2(auVar39,auVar61);
  local_5e0 = vpsrad_avx2(auVar3,auVar61);
  local_5c0 = vpsrad_avx2(auVar36,auVar61);
  local_5a0 = vpsrad_avx2(auVar35,auVar61);
  uVar12 = 0x20;
  do {
    lVar11 = 0;
    uVar15 = uVar12;
    do {
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4),
                           *(undefined1 (*) [32])(puVar8 + lVar11));
      auVar36 = vpsubd_avx2(*(undefined1 (*) [32])(puVar8 + lVar11),
                            *(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar36,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(puVar8 + lVar11) = auVar3;
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 7) * 4) = auVar2;
      auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4),
                           *(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4));
      auVar36 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4));
      auVar2 = vpmaxsd_avx2(auVar2,auVar6);
      auVar3 = vpminsd_avx2(auVar2,auVar5);
      auVar2 = vpmaxsd_avx2(auVar36,auVar6);
      auVar2 = vpminsd_avx2(auVar2,auVar5);
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 0xf) * 4) = auVar3;
      *(undefined1 (*) [32])(local_840 + (uVar15 ^ 8) * 4) = auVar2;
      uVar15 = uVar15 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    puVar8 = puVar8 + 0x200;
    uVar10 = (uint)uVar12;
    uVar12 = uVar12 + 0x10;
  } while (uVar10 < 0x30);
  pauVar9 = &local_760;
  lVar11 = 0;
  do {
    auVar2 = vpaddd_avx2(*pauVar9,*(undefined1 (*) [32])((long)local_840 + lVar11));
    auVar36 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar11),*pauVar9);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])((long)local_840 + lVar11) = auVar3;
    *pauVar9 = auVar2;
    pauVar9 = pauVar9 + -1;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x80);
  pauVar9 = &local_640;
  auVar2 = vpmulld_avx2(local_700,auVar45);
  auVar3 = vpmulld_avx2(local_6a0,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar36 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_6a0,local_700);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_6a0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_6e0,auVar45);
  auVar3 = vpmulld_avx2(local_6c0,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_6c0,local_6e0);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_6c0 = vpsrad_avx2(auVar2,auVar61);
  local_700 = auVar36;
  local_6e0 = auVar3;
  uVar12 = 0x10;
  do {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4),*pauVar9);
    auVar36 = vpsubd_avx2(*pauVar9,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar9 = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4) = auVar2;
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4),
                         *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar36 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),
                          *(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4) = auVar2;
    uVar12 = uVar12 + 1;
    pauVar9 = pauVar9 + 1;
  } while (uVar12 != 0x14);
  pauVar9 = &local_660;
  auVar2 = vpmulld_avx2(local_3c0,auVar48);
  auVar3 = vpmulld_avx2(local_e0,auVar38);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_3a0,auVar48);
  auVar36 = vpmulld_avx2(local_100,auVar38);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar36,auVar3);
  auVar36 = vpmulld_avx2(local_380,auVar48);
  auVar35 = vpmulld_avx2(local_120,auVar38);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_360,auVar48);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar39 = vpmulld_avx2(local_140,auVar38);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpmulld_avx2(local_360,auVar38);
  auVar37 = vpmulld_avx2(local_140,auVar33);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar37,auVar39);
  auVar37 = vpsrad_avx2(auVar2,auVar61);
  auVar41 = vpsrad_avx2(auVar3,auVar61);
  auVar36 = vpsrad_avx2(auVar36,auVar61);
  local_360 = vpsrad_avx2(auVar35,auVar61);
  local_140 = vpsrad_avx2(auVar39,auVar61);
  auVar2 = vpmulld_avx2(local_380,auVar38);
  auVar3 = vpmulld_avx2(local_120,auVar33);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_120 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_3a0,auVar38);
  auVar3 = vpmulld_avx2(local_100,auVar33);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_100 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar38,local_3c0);
  auVar3 = vpmulld_avx2(auVar33,local_e0);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_e0 = vpsrad_avx2(auVar2,auVar61);
  local_3c0 = auVar37;
  local_3a0 = auVar41;
  local_380 = auVar36;
  auVar2 = vpmulld_avx2(local_340,auVar34);
  auVar3 = vpmulld_avx2(local_160,auVar48);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_320,auVar34);
  auVar36 = vpmulld_avx2(local_180,auVar48);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar36 = vpmulld_avx2(local_300,auVar34);
  auVar35 = vpmulld_avx2(local_1a0,auVar48);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar39 = vpmulld_avx2(local_2e0,auVar34);
  auVar35 = vpmulld_avx2(local_2e0,auVar48);
  auVar37 = vpmulld_avx2(local_1c0,auVar38);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar35 = vpaddd_avx2(auVar35,auVar37);
  auVar37 = vpmulld_avx2(local_1c0,auVar48);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_1c0 = vpsrad_avx2(auVar35,auVar61);
  auVar35 = vpaddd_avx2(auVar39,auVar37);
  auVar39 = vpmulld_avx2(local_300,auVar48);
  auVar37 = vpmulld_avx2(local_1a0,auVar38);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_1a0 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(local_320,auVar48);
  auVar37 = vpmulld_avx2(local_180,auVar38);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_180 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(local_340,auVar48);
  auVar37 = vpmulld_avx2(local_160,auVar38);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar39 = vpaddd_avx2(auVar39,auVar37);
  local_340 = vpsrad_avx2(auVar2,auVar61);
  local_160 = vpsrad_avx2(auVar39,auVar61);
  local_320 = vpsrad_avx2(auVar3,auVar61);
  local_300 = vpsrad_avx2(auVar36,auVar61);
  local_2e0 = vpsrad_avx2(auVar35,auVar61);
  lVar11 = 0;
  do {
    auVar2 = vpaddd_avx2(*pauVar9,*(undefined1 (*) [32])((long)local_840 + lVar11));
    auVar36 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar11),*pauVar9);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])((long)local_840 + lVar11) = auVar3;
    *pauVar9 = auVar2;
    lVar11 = lVar11 + 0x20;
    pauVar9 = pauVar9 + -1;
  } while (lVar11 != 0x100);
  pauVar9 = &local_440;
  auVar2 = vpmulld_avx2(local_5c0,auVar45);
  auVar3 = vpmulld_avx2(local_4e0,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_5a0,auVar45);
  auVar36 = vpmulld_avx2(local_500,auVar29);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar36 = vpmulld_avx2(local_580,auVar45);
  auVar35 = vpmulld_avx2(local_520,auVar29);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_560,auVar45);
  auVar39 = vpmulld_avx2(local_540,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpaddd_avx2(local_540,local_560);
  auVar39 = vpmulld_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_540 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpaddd_avx2(local_520,local_580);
  auVar39 = vpmulld_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_520 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpaddd_avx2(local_500,local_5a0);
  auVar39 = vpmulld_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_500 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpaddd_avx2(local_5c0,local_4e0);
  local_5c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(auVar39,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_4e0 = vpsrad_avx2(auVar2,auVar61);
  local_5a0 = vpsrad_avx2(auVar3,auVar61);
  local_580 = vpsrad_avx2(auVar36,auVar61);
  local_560 = vpsrad_avx2(auVar35,auVar61);
  uVar12 = 0x20;
  do {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),*pauVar9);
    auVar36 = vpsubd_avx2(*pauVar9,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar9 = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar2;
    uVar12 = uVar12 + 1;
    pauVar9 = pauVar9 + 1;
  } while (uVar12 != 0x28);
  uVar12 = 0x30;
  pauVar9 = &local_240;
  do {
    auVar2 = vpaddd_avx2(*pauVar9,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar36 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),*pauVar9);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar3;
    *pauVar9 = auVar2;
    uVar12 = uVar12 + 1;
    pauVar9 = pauVar9 + 1;
  } while (uVar12 != 0x38);
  pauVar9 = &local_460;
  lVar11 = 0;
  do {
    auVar2 = vpaddd_avx2(*pauVar9,*(undefined1 (*) [32])((long)local_840 + lVar11));
    auVar36 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar11),*pauVar9);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar36,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])((long)local_840 + lVar11) = auVar3;
    *pauVar9 = auVar2;
    lVar11 = lVar11 + 0x20;
    pauVar9 = pauVar9 + -1;
  } while (lVar11 != 0x200);
  auVar2 = vpmulld_avx2(local_340,auVar45);
  auVar3 = vpmulld_avx2(local_160,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_320,auVar45);
  auVar36 = vpmulld_avx2(local_180,auVar29);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar36 = vpmulld_avx2(local_300,auVar45);
  auVar35 = vpmulld_avx2(local_1a0,auVar29);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar35 = vpmulld_avx2(local_2e0,auVar45);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  auVar39 = vpmulld_avx2(local_1c0,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar39);
  auVar39 = vpaddd_avx2(local_1c0,local_2e0);
  auVar41 = vpsrad_avx2(auVar2,auVar61);
  auVar30 = vpsrad_avx2(auVar3,auVar61);
  auVar32 = vpsrad_avx2(auVar36,auVar61);
  local_2e0 = vpsrad_avx2(auVar35,auVar61);
  auVar2 = vpmulld_avx2(auVar39,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_1c0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_1a0,local_300);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_1a0 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_180,local_320);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_180 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpaddd_avx2(local_340,local_160);
  auVar2 = vpmulld_avx2(auVar2,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  local_160 = vpsrad_avx2(auVar2,auVar61);
  auVar2 = vpmulld_avx2(local_2c0,auVar45);
  auVar3 = vpmulld_avx2(local_1e0,auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_2a0,auVar45);
  auVar36 = vpmulld_avx2(local_200,auVar29);
  auVar3 = vpaddd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar3,auVar36);
  auVar36 = vpmulld_avx2(local_280,auVar45);
  auVar35 = vpmulld_avx2(local_220,auVar29);
  auVar36 = vpaddd_avx2(auVar36,auVar28);
  auVar36 = vpaddd_avx2(auVar36,auVar35);
  auVar39 = vpmulld_avx2(local_260,auVar45);
  auVar35 = vpaddd_avx2(local_240,local_260);
  auVar37 = vpmulld_avx2(local_240,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar35 = vpmulld_avx2(auVar35,auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar28);
  local_240 = vpsrad_avx2(auVar35,auVar61);
  auVar35 = vpaddd_avx2(auVar39,auVar37);
  auVar39 = vpaddd_avx2(local_220,local_280);
  auVar37 = vpaddd_avx2(local_200,local_2a0);
  auVar39 = vpmulld_avx2(auVar39,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_220 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpmulld_avx2(auVar37,auVar29);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  local_200 = vpsrad_avx2(auVar39,auVar61);
  auVar39 = vpaddd_avx2(local_1e0,local_2c0);
  auVar39 = vpmulld_avx2(auVar39,auVar29);
  local_2c0 = vpsrad_avx2(auVar2,auVar61);
  local_2a0 = vpsrad_avx2(auVar3,auVar61);
  local_280 = vpsrad_avx2(auVar36,auVar61);
  local_260 = vpsrad_avx2(auVar35,auVar61);
  auVar2 = vpaddd_avx2(auVar39,auVar28);
  local_1e0 = vpsrad_avx2(auVar2,auVar61);
  iStack_a5c = local_a60;
  iStack_a58 = local_a60;
  iStack_a54 = local_a60;
  iStack_a50 = local_a60;
  iStack_a4c = local_a60;
  iStack_a48 = local_a60;
  iStack_a44 = local_a60;
  iStack_a3c = local_a40;
  iStack_a38 = local_a40;
  iStack_a34 = local_a40;
  iStack_a30 = local_a40;
  iStack_a2c = local_a40;
  iStack_a28 = local_a40;
  iStack_a24 = local_a40;
  local_340 = auVar41;
  local_320 = auVar30;
  local_300 = auVar32;
  idct64_stage11_avx2(&local_840,out,do_cols,bd,out_shift,(__m256i *)&local_a40,
                      (__m256i *)&local_a60);
  return;
}

Assistant:

static void idct64_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi1 = _mm256_set1_epi32(cospi[1]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi3 = _mm256_set1_epi32(cospi[3]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi5 = _mm256_set1_epi32(cospi[5]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi7 = _mm256_set1_epi32(cospi[7]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi9 = _mm256_set1_epi32(cospi[9]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi11 = _mm256_set1_epi32(cospi[11]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi13 = _mm256_set1_epi32(cospi[13]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi15 = _mm256_set1_epi32(cospi[15]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi51 = _mm256_set1_epi32(cospi[51]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi55 = _mm256_set1_epi32(cospi[55]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi59 = _mm256_set1_epi32(cospi[59]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi63 = _mm256_set1_epi32(cospi[63]);

  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim12 = _mm256_set1_epi32(-cospi[12]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospim28 = _mm256_set1_epi32(-cospi[28]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim44 = _mm256_set1_epi32(-cospi[44]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim49 = _mm256_set1_epi32(-cospi[49]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim53 = _mm256_set1_epi32(-cospi[53]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim57 = _mm256_set1_epi32(-cospi[57]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim60 = _mm256_set1_epi32(-cospi[60]);
  const __m256i cospim61 = _mm256_set1_epi32(-cospi[61]);

  {
    __m256i u[64];
    __m256i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_avx2(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_avx2(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_avx2(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_avx2(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_avx2(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_avx2(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_avx2(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_avx2(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_avx2(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_avx2(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_avx2(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_avx2(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_avx2(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_avx2(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_avx2(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_avx2(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_avx2(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_avx2(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_avx2(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_avx2(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_avx2(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_avx2(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_avx2(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_avx2(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_avx2(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_avx2(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_avx2(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_avx2(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_avx2(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_avx2(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_avx2(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_avx2(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_avx2(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_avx2(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_avx2(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_avx2(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_avx2(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_avx2(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_avx2(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_avx2(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_avx2(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_avx2(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_avx2(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_avx2(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                  &clamp_hi);

      addsub_avx2(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                  &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_avx2(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_avx2(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_avx2(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_avx2(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                  &clamp_hi);

      addsub_avx2(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                  &clamp_hi);
      addsub_avx2(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                  &clamp_hi);
    }

    tmp1 = half_btf_avx2(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_avx2(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_avx2(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_avx2(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_avx2(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_avx2(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_avx2(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_avx2(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_avx2(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_avx2(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_avx2(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_avx2(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_avx2(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_avx2(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_avx2(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_avx2(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_avx2(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_avx2(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_avx2(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_avx2(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_avx2(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_avx2(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_avx2(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                    &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_avx2(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_avx2(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                       bit);

    // stage 10
    idct64_stage10_avx2(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                        bit);

    // stage 11
    idct64_stage11_avx2(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}